

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TupleOptimization.cpp
# Opt level: O2

void __thiscall wasm::TupleOptimization::optimize(TupleOptimization *this,Function *func)

{
  __node_base_ptr *this_00;
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar4;
  bool bVar5;
  Index IVar6;
  size_t sVar7;
  mapped_type *pmVar8;
  Type *pTVar9;
  Index IVar10;
  __node_base *p_Var11;
  uint uVar12;
  ulong uVar13;
  reference rVar14;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar15;
  undefined1 local_280 [8];
  UniqueDeferredQueue<unsigned_int> work;
  MapApplier mapApplier;
  undefined1 local_d8 [8];
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  tupleToNewBaseMap;
  vector<bool,_std::allocator<bool>_> bad;
  vector<bool,_std::allocator<bool>_> good;
  uint local_34;
  
  sVar7 = Function::getNumLocals(func);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&tupleToNewBaseMap._M_h._M_single_bucket,sVar7,
             (allocator_type *)&work.count._M_h._M_single_bucket);
  UniqueDeferredQueue<unsigned_int>::UniqueDeferredQueue
            ((UniqueDeferredQueue<unsigned_int> *)local_280);
  uVar12 = 0;
  while( true ) {
    uVar13 = (ulong)uVar12;
    puVar3 = (this->uses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->uses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <= uVar13) {
      this_00 = &tupleToNewBaseMap._M_h._M_single_bucket;
      while (bVar5 = UniqueDeferredQueue<unsigned_int>::empty
                               ((UniqueDeferredQueue<unsigned_int> *)local_280), !bVar5) {
        uVar12 = UniqueDeferredQueue<unsigned_int>::pop
                           ((UniqueDeferredQueue<unsigned_int> *)local_280);
        uVar13 = (ulong)uVar12;
        rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)this_00,uVar13);
        if ((*rVar14._M_p & rVar14._M_mask) == 0) {
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)this_00,uVar13);
          *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
          p_Var11 = &(this->copiedIndexes).
                     super__Vector_base<std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13]._M_h._M_before_begin;
          while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
            UniqueDeferredQueue<unsigned_int>::push
                      ((UniqueDeferredQueue<unsigned_int> *)local_280,
                       (uint)*(size_type *)(p_Var11 + 1));
          }
        }
      }
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)
                 &bad.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage,sVar7,(allocator_type *)&work.count._M_h._M_single_bucket);
      uVar12 = 0;
      bVar5 = false;
      while( true ) {
        uVar13 = (ulong)uVar12;
        puVar3 = (this->uses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->uses).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <= uVar13) break;
        if ((puVar3[uVar13] != 0) &&
           (rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)
                                &tupleToNewBaseMap._M_h._M_single_bucket,uVar13),
           (*rVar14._M_p & rVar14._M_mask) == 0)) {
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              &bad.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage,uVar13);
          *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
          bVar5 = true;
        }
        uVar12 = uVar12 + 1;
      }
      if (bVar5) {
        local_d8 = (undefined1  [8])&tupleToNewBaseMap._M_h._M_rehash_policy._M_next_resize;
        tupleToNewBaseMap._M_h._M_buckets = (__buckets_ptr)0x1;
        tupleToNewBaseMap._M_h._M_bucket_count = 0;
        tupleToNewBaseMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        tupleToNewBaseMap._M_h._M_element_count._0_4_ = 0x3f800000;
        tupleToNewBaseMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        tupleToNewBaseMap._M_h._M_rehash_policy._4_4_ = 0;
        tupleToNewBaseMap._M_h._M_rehash_policy._M_next_resize = 0;
        for (local_34 = 0;
            (ulong)local_34 <
            (ulong)(uint)good.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p +
            (good.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._8_8_ -
            (long)bad.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage) * 8; local_34 = local_34 + 1) {
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              &bad.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage,(ulong)local_34);
          if ((*rVar14._M_p & rVar14._M_mask) != 0) {
            sVar7 = Function::getNumLocals(func);
            pmVar8 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_d8,&local_34);
            *pmVar8 = (mapped_type)sVar7;
            good.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage = (_Bit_pointer)Function::getLocalType(func,local_34);
            work.count._M_h._M_single_bucket =
                 (__node_base_ptr)
                 &good.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage;
            mapApplier.
            super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
            .
            super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
            .replacep = (Expression **)0x0;
            PVar15 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                     wasm::Type::end((Type *)work.count._M_h._M_single_bucket);
            IVar10 = 0;
            for (; PVar4.index = (size_t)mapApplier.
                                         super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                                         .
                                         super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                                         .replacep,
                PVar4.parent = (Type *)work.count._M_h._M_single_bucket, PVar15 != PVar4;
                mapApplier.
                super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                .
                super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                .replacep = (Expression **)
                            ((long)mapApplier.
                                   super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                                   .
                                   super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                                   .replacep + 1)) {
              pTVar9 = wasm::Type::Iterator::operator*
                                 ((Iterator *)&work.count._M_h._M_single_bucket);
              IVar6 = Builder::addVar(func,(Type)pTVar9->id);
              if (IVar10 == 0) {
                if (sVar7 != IVar6) {
                  __assert_fail("newIndex == newBase",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TupleOptimization.cpp"
                                ,0xde,"void wasm::TupleOptimization::optimize(Function *)");
                }
              }
              else if (IVar6 != IVar10 + 1) {
                __assert_fail("newIndex == lastNewIndex + 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TupleOptimization.cpp"
                              ,0xe1,"void wasm::TupleOptimization::optimize(Function *)");
              }
              IVar10 = IVar6;
            }
          }
        }
        mapApplier.tupleToNewBaseMap =
             (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)&mapApplier.replacedTees._M_h._M_rehash_policy._M_next_resize;
        work.count._M_h._M_single_bucket = (__node_base_ptr)0x0;
        mapApplier.
        super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .
        super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .replacep = (Expression **)0x0;
        mapApplier.
        super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .
        super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .stack.fixed._M_elems[9].currp = (Expression **)0x0;
        mapApplier.
        super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .
        super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        mapApplier.
        super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .
        super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .currFunction = (Function *)0x0;
        mapApplier.
        super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .
        super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        mapApplier.
        super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .
        super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        mapApplier.
        super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .
        super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        .currModule = (Module *)local_d8;
        mapApplier.replacedTees._M_h._M_buckets = (__buckets_ptr)0x1;
        mapApplier.replacedTees._M_h._M_bucket_count = 0;
        mapApplier.replacedTees._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        mapApplier.replacedTees._M_h._M_element_count._0_4_ = 0x3f800000;
        mapApplier.replacedTees._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        mapApplier.replacedTees._M_h._M_rehash_policy._4_4_ = 0;
        mapApplier.replacedTees._M_h._M_rehash_policy._M_next_resize = 0;
        Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
        ::walkFunctionInModule
                  ((Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                    *)&work.count._M_h._M_single_bucket,func,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::TupleOptimization,_wasm::Visitor<wasm::TupleOptimization,_void>_>_>
                   ).
                   super_PostWalker<wasm::TupleOptimization,_wasm::Visitor<wasm::TupleOptimization,_void>_>
                   .
                   super_Walker<wasm::TupleOptimization,_wasm::Visitor<wasm::TupleOptimization,_void>_>
                   .currModule);
        MapApplier::~MapApplier((MapApplier *)&work.count._M_h._M_single_bucket);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)local_d8);
      }
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)
                 &bad.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage);
      UniqueDeferredQueue<unsigned_int>::~UniqueDeferredQueue
                ((UniqueDeferredQueue<unsigned_int> *)local_280);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)&tupleToNewBaseMap._M_h._M_single_bucket);
      return;
    }
    uVar1 = puVar3[uVar13];
    uVar2 = (this->validUses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar13];
    if (uVar1 < uVar2) break;
    if (uVar2 < uVar1) {
      UniqueDeferredQueue<unsigned_int>::push((UniqueDeferredQueue<unsigned_int> *)local_280,uVar12)
      ;
    }
    uVar12 = uVar12 + 1;
  }
  __assert_fail("validUses[i] <= uses[i]",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TupleOptimization.cpp"
                ,0xa9,"void wasm::TupleOptimization::optimize(Function *)");
}

Assistant:

void optimize(Function* func) {
    auto numLocals = func->getNumLocals();

    // Find the set of bad indexes. We add each such candidate to a worklist
    // that we will then flow to find all those corrupted.
    std::vector<bool> bad(numLocals);
    UniqueDeferredQueue<Index> work;

    for (Index i = 0; i < uses.size(); i++) {
      assert(validUses[i] <= uses[i]);
      if (uses[i] > 0 && validUses[i] < uses[i]) {
        // This is a bad tuple.
        work.push(i);
      }
    }

    // Flow badness forward.
    while (!work.empty()) {
      auto i = work.pop();
      if (bad[i]) {
        continue;
      }
      bad[i] = true;
      for (auto target : copiedIndexes[i]) {
        work.push(target);
      }
    }

    // Good indexes we can optimize are tuple locals with uses that are not bad.
    std::vector<bool> good(numLocals);
    bool hasGood = false;
    for (Index i = 0; i < uses.size(); i++) {
      if (uses[i] > 0 && !bad[i]) {
        good[i] = true;
        hasGood = true;
      }
    }

    if (!hasGood) {
      return;
    }

    // We found things to optimize! Create new non-tuple locals for their
    // contents, and then rewrite the code to use those according to the
    // mapping from tuple locals to normal ones. The mapping maps a tuple local
    // to the base index used for its contents: an index and several others
    // right after it, depending on the tuple size.
    std::unordered_map<Index, Index> tupleToNewBaseMap;
    for (Index i = 0; i < good.size(); i++) {
      if (!good[i]) {
        continue;
      }

      auto newBase = func->getNumLocals();
      tupleToNewBaseMap[i] = newBase;
      Index lastNewIndex = 0;
      for (auto t : func->getLocalType(i)) {
        Index newIndex = Builder::addVar(func, t);
        if (lastNewIndex == 0) {
          // This is the first new local we added (0 is an impossible value,
          // since tuple locals exist, hence index 0 was already taken), so it
          // must be equal to the base.
          assert(newIndex == newBase);
        } else {
          // This must be right after the former.
          assert(newIndex == lastNewIndex + 1);
        }
        lastNewIndex = newIndex;
      }
    }

    MapApplier mapApplier(tupleToNewBaseMap);
    mapApplier.walkFunctionInModule(func, getModule());
  }